

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astSwitchNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_astCaseNode_t *slotCount;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t caseDestinations;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t instruction;
  sysbvm_tuple_t caseValue;
  sysbvm_tuple_t caseLabel_1;
  sysbvm_astCaseNode_t *caseNode_1;
  size_t i_1;
  sysbvm_tuple_t caseLabel;
  sysbvm_tuple_t caseKey;
  sysbvm_astCaseNode_t *caseNode;
  size_t i;
  size_t caseCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_40312783 gcFrame;
  sysbvm_astSwitchNode_t **switchNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&caseCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&caseCount);
  sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                     *(sysbvm_tuple_t *)(*arguments + 0x28));
  slotCount = (sysbvm_astCaseNode_t *)sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  sVar3 = sysbvm_array_create(context,(sysbvm_tuple_t)slotCount);
  caseDestinations = sysbvm_array_create(context,(sysbvm_tuple_t)slotCount);
  for (caseNode = (sysbvm_astCaseNode_t *)0x0; caseNode < slotCount;
      caseNode = (sysbvm_astCaseNode_t *)((long)&(caseNode->super).header.field_0 + 1)) {
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),(size_t)caseNode);
    sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                       *(sysbvm_tuple_t *)(sVar4 + 0x28));
    sysbvm_array_atPut(sVar3,(size_t)caseNode,sVar4);
    sVar4 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    sysbvm_array_atPut(caseDestinations,(size_t)caseNode,sVar4);
  }
  sVar4 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sysbvm_functionBytecodeAssembler_caseJump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,sVar3,
             caseDestinations,sVar4);
  sVar2 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  for (caseNode_1 = (sysbvm_astCaseNode_t *)0x0; caseNode_1 < slotCount;
      caseNode_1 = (sysbvm_astCaseNode_t *)((long)&(caseNode_1->super).header.field_0 + 1)) {
    sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),(size_t)caseNode_1);
    instruction = sysbvm_array_at(caseDestinations,(size_t)caseNode_1);
    sysbvm_functionBytecodeAssembler_addInstruction
              (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),instruction);
    sVar3 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                       *(sysbvm_tuple_t *)(sVar3 + 0x30));
    sysbvm_functionBytecodeAssembler_move
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,sVar3);
    sysbvm_functionBytecodeAssembler_jump
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
               (sysbvm_tuple_t)gcFrameRecord.roots);
  }
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar4);
  if (*(long *)(*arguments + 0x38) == 0) {
    gcFrame.defaultLabel =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),0);
  }
  else {
    gcFrame.defaultLabel =
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                    *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2,
             gcFrame.defaultLabel);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSwitchNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astSwitchNode_t **switchNode = (sysbvm_astSwitchNode_t**)node;
    struct {
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t result;
        sysbvm_tuple_t value;
        sysbvm_tuple_t keyList;
        sysbvm_tuple_t caseLabelList;
        sysbvm_tuple_t defaultLabel;
        sysbvm_tuple_t defaultResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Emit the value.
    gcFrame.value = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->expression);

    // Emit the keys.
    size_t caseCount = sysbvm_array_getSize((*switchNode)->caseExpressions);
    gcFrame.keyList = sysbvm_array_create(context, caseCount);
    gcFrame.caseLabelList = sysbvm_array_create(context, caseCount);
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseKey = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->keyExpression);
        sysbvm_array_atPut(gcFrame.keyList, i, caseKey);

        sysbvm_tuple_t caseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
        sysbvm_array_atPut(gcFrame.caseLabelList, i, caseLabel);
    }

    gcFrame.defaultLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the switch.
    sysbvm_functionBytecodeAssembler_caseJump(context, (*compiler)->assembler, gcFrame.value, gcFrame.keyList, gcFrame.caseLabelList, gcFrame.defaultLabel);

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*switchNode)->super.analyzedType);

    // Emit the different cases.
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseLabel = sysbvm_array_at(gcFrame.caseLabelList, i);
        sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, caseLabel);

        sysbvm_tuple_t caseValue = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->valueExpression);
        sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, caseValue);
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);
    }

    // Emit the default case.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.defaultLabel);
    if((*switchNode)->defaultExpression)
        gcFrame.defaultResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->defaultExpression);
    else
        gcFrame.defaultResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.defaultResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}